

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O2

void int_trp_warning(int line,char *file,char *format,...)

{
  long *plVar1;
  code *pcVar2;
  long lVar3;
  char *pcVar4;
  char in_AL;
  bool bVar5;
  int iVar6;
  undefined8 in_RCX;
  char *pcVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t __maxlen;
  char *__s;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_138 [24];
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88 [4];
  undefined8 local_68;
  va_list values;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  char *local_40;
  int local_38;
  allocator<char> local_31;
  
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  __maxlen = 0x400;
  __s = local_138;
  local_120 = in_RCX;
  local_118 = in_R8;
  local_110 = in_R9;
  local_40 = file;
  local_38 = line;
  do {
    pcVar7 = __s;
    lVar3 = -__maxlen;
    __s = pcVar7 + lVar3;
    values[0].overflow_arg_area = local_138;
    values[0]._0_8_ = &stack0x00000008;
    local_68 = 0x3000000018;
    __s[-8] = -0x2a;
    __s[-7] = '\t';
    __s[-6] = '\x11';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    iVar6 = vsnprintf(__s,__maxlen,format,&local_68);
    if (iVar6 < 0) {
      __maxlen = (size_t)((int)__maxlen + 0x400);
    }
    __s[-8] = -0x14;
    __s[-7] = '\t';
    __s[-6] = '\x11';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    bVar5 = IsMsgSizeOk((uint32_t)__maxlen);
  } while ((iVar6 < 0) && (bVar5));
  builtin_strncpy(pcVar7 + lVar3 + -8,"\x01\n\x11",4);
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  trun::TestRunner::GetCurrentTestModule();
  builtin_strncpy(pcVar7 + lVar3 + -8,"\x14\n\x11",4);
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)local_88,__s,&local_31);
  iVar6 = local_38;
  pcVar4 = local_40;
  plVar1 = *(long **)((long)values[0].reg_save_area + 0x150);
  pcVar2 = *(code **)(*plVar1 + 0x28);
  builtin_strncpy(pcVar7 + lVar3 + -8,"6\n\x11",4);
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  (*pcVar2)(plVar1,"%s:%d:%s",pcVar4,iVar6,local_88[0]);
  builtin_strncpy(pcVar7 + lVar3 + -8,"?\n\x11",4);
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::~string((string *)local_88);
  builtin_strncpy(pcVar7 + lVar3 + -8,"H\n\x11",4);
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  return;
}

Assistant:

static void int_trp_warning(int line, const char *file, const char *format, ...) {
    CREATE_REPORT_STRING()
    TestRunner::GetCurrentTestModule()->GetTestResponseProxy().Warning(line, file, std::string(newstr));
}